

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  bool bVar1;
  ImGuiTabItemFlags IVar2;
  ImGuiID IVar3;
  ImGuiTabItemFlags IVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  ImGuiTabItem *pIVar11;
  ImGuiTabItem *pIVar12;
  ImGuiShrinkWidthItem *pIVar13;
  int *in_RDI;
  float fVar14;
  float fVar15;
  ImVec2 IVar16;
  bool teleport;
  ImGuiTabItem *scroll_track_selected_tab;
  ImGuiTabItem *tab_to_select_1;
  bool scrolling_buttons;
  ImGuiTabItem *tab_3;
  int tab_n_3;
  float offset_x_ideal;
  float offset_x;
  ImGuiTabItem *tab_2;
  int tab_n_2;
  float tab_max_width;
  int tab_n_1;
  float width_excess;
  float width_avail;
  float initial_offset_x;
  bool has_close_button;
  char *tab_name;
  ImGuiTabItem *tab_1;
  int tab_n;
  bool found_selected_tab_id;
  ImGuiTabItem *most_recently_selected_tab;
  float width_total_contents;
  ImGuiTabItem *tab_to_select;
  bool tab_list_popup_button;
  ImGuiTabItem item_tmp;
  ImGuiTabItem *tab2;
  int tab2_order;
  ImGuiTabItem *tab1;
  ImGuiID scroll_track_selected_tab_id;
  ImGuiTabItem *tab;
  int tab_src_n;
  int tab_dst_n;
  ImGuiContext *g;
  float in_stack_fffffffffffffec8;
  undefined3 uVar17;
  float in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  uint in_stack_fffffffffffffed4;
  uint uVar18;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  ImGuiTabBar *in_stack_ffffffffffffff10;
  int local_d4;
  float local_d0;
  float local_cc;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int local_b4;
  float local_a4;
  int local_88;
  ImGuiTabItem *local_80;
  float local_74;
  ImGuiID IVar19;
  int local_18;
  int local_14;
  ImGuiContext *tab_bar_00;
  
  tab_bar_00 = GImGui;
  *(undefined1 *)((long)in_RDI + 0x61) = 0;
  local_14 = 0;
  for (local_18 = 0; local_18 < *in_RDI; local_18 = local_18 + 1) {
    pIVar11 = ImVector<ImGuiTabItem>::operator[]
                        ((ImVector<ImGuiTabItem> *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (int)in_stack_fffffffffffffecc);
    if (pIVar11->LastFrameVisible < in_RDI[9]) {
      if (pIVar11->ID == in_RDI[5]) {
        in_RDI[5] = 0;
      }
    }
    else {
      if (local_14 != local_18) {
        pIVar11 = ImVector<ImGuiTabItem>::operator[]
                            ((ImVector<ImGuiTabItem> *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (int)in_stack_fffffffffffffecc);
        pIVar12 = ImVector<ImGuiTabItem>::operator[]
                            ((ImVector<ImGuiTabItem> *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (int)in_stack_fffffffffffffecc);
        IVar2 = pIVar11->Flags;
        pIVar12->ID = pIVar11->ID;
        pIVar12->Flags = IVar2;
        iVar10 = pIVar11->LastFrameSelected;
        pIVar12->LastFrameVisible = pIVar11->LastFrameVisible;
        pIVar12->LastFrameSelected = iVar10;
        fVar14 = pIVar11->Offset;
        pIVar12->NameOffset = pIVar11->NameOffset;
        pIVar12->Offset = fVar14;
        fVar14 = pIVar11->ContentWidth;
        pIVar12->Width = pIVar11->Width;
        pIVar12->ContentWidth = fVar14;
      }
      local_14 = local_14 + 1;
    }
  }
  if (*in_RDI != local_14) {
    ImVector<ImGuiTabItem>::resize
              ((ImVector<ImGuiTabItem> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (int)in_stack_fffffffffffffecc);
  }
  IVar19 = 0;
  if (in_RDI[6] != 0) {
    in_RDI[5] = in_RDI[6];
    in_RDI[6] = 0;
    IVar19 = in_RDI[5];
  }
  if (in_RDI[0x17] != 0) {
    pIVar11 = TabBarFindTabByID((ImGuiTabBar *)
                                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
    if (pIVar11 != (ImGuiTabItem *)0x0) {
      iVar10 = ImGuiTabBar::GetTabOrder
                         ((ImGuiTabBar *)
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (ImGuiTabItem *)
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      iVar10 = iVar10 + (char)in_RDI[0x18];
      if ((-1 < iVar10) && (iVar10 < *in_RDI)) {
        pIVar12 = ImVector<ImGuiTabItem>::operator[]
                            ((ImVector<ImGuiTabItem> *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             (int)in_stack_fffffffffffffecc);
        IVar3 = pIVar11->ID;
        IVar4 = pIVar11->Flags;
        iVar5 = pIVar11->LastFrameVisible;
        iVar6 = pIVar11->LastFrameSelected;
        iVar7 = pIVar11->NameOffset;
        fVar15 = pIVar11->Offset;
        fVar8 = pIVar11->Width;
        fVar9 = pIVar11->ContentWidth;
        IVar2 = pIVar12->Flags;
        pIVar11->ID = pIVar12->ID;
        pIVar11->Flags = IVar2;
        iVar10 = pIVar12->LastFrameSelected;
        pIVar11->LastFrameVisible = pIVar12->LastFrameVisible;
        pIVar11->LastFrameSelected = iVar10;
        fVar14 = pIVar12->Offset;
        pIVar11->NameOffset = pIVar12->NameOffset;
        pIVar11->Offset = fVar14;
        fVar14 = pIVar12->ContentWidth;
        pIVar11->Width = pIVar12->Width;
        pIVar11->ContentWidth = fVar14;
        pIVar12->ID = IVar3;
        pIVar12->Flags = IVar4;
        pIVar12->LastFrameVisible = iVar5;
        pIVar12->LastFrameSelected = iVar6;
        pIVar12->NameOffset = iVar7;
        pIVar12->Offset = fVar15;
        pIVar12->Width = fVar8;
        pIVar12->ContentWidth = fVar9;
        if (pIVar12->ID == in_RDI[5]) {
          IVar19 = pIVar12->ID;
        }
      }
      if ((in_RDI[0x16] & 0x400000U) != 0) {
        MarkIniSettingsDirty();
      }
    }
    in_RDI[0x17] = 0;
  }
  if (((in_RDI[0x16] & 4U) != 0) &&
     (pIVar11 = TabBarTabListPopupButton
                          ((ImGuiTabBar *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)),
     pIVar11 != (ImGuiTabItem *)0x0)) {
    IVar19 = pIVar11->ID;
    in_RDI[5] = IVar19;
  }
  ImVector<ImGuiShrinkWidthItem>::resize
            ((ImVector<ImGuiShrinkWidthItem> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (int)in_stack_fffffffffffffecc);
  local_74 = 0.0;
  local_80 = (ImGuiTabItem *)0x0;
  bVar1 = false;
  for (local_88 = 0; local_88 < *in_RDI; local_88 = local_88 + 1) {
    pIVar11 = ImVector<ImGuiTabItem>::operator[]
                        ((ImVector<ImGuiTabItem> *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (int)in_stack_fffffffffffffecc);
    if (pIVar11->LastFrameVisible < in_RDI[9]) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1a7d,"TabBarLayout","ImGui ASSERT FAILED: %s",
                  "tab->LastFrameVisible >= tab_bar->PrevFrameVisible");
    }
    if ((local_80 == (ImGuiTabItem *)0x0) ||
       (local_80->LastFrameSelected < pIVar11->LastFrameSelected)) {
      local_80 = pIVar11;
    }
    if (pIVar11->ID == in_RDI[5]) {
      bVar1 = true;
    }
    ImGuiTabBar::GetTabName
              ((ImGuiTabBar *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (ImGuiTabItem *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    IVar16 = TabItemCalcSize((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                             SUB41((uint)in_stack_fffffffffffffee4 >> 0x18,0));
    local_a4 = IVar16.x;
    pIVar11->ContentWidth = local_a4;
    if (local_88 < 1) {
      in_stack_fffffffffffffef4 = 0.0;
    }
    else {
      in_stack_fffffffffffffef4 = (tab_bar_00->Style).ItemInnerSpacing.x;
    }
    local_74 = in_stack_fffffffffffffef4 + pIVar11->ContentWidth + local_74;
    in_stack_fffffffffffffeec = local_88;
    pIVar13 = ImVector<ImGuiShrinkWidthItem>::operator[]
                        ((ImVector<ImGuiShrinkWidthItem> *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (int)in_stack_fffffffffffffecc);
    pIVar13->Index = in_stack_fffffffffffffeec;
    in_stack_fffffffffffffef0 = pIVar11->ContentWidth;
    pIVar13 = ImVector<ImGuiShrinkWidthItem>::operator[]
                        ((ImVector<ImGuiShrinkWidthItem> *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (int)in_stack_fffffffffffffecc);
    pIVar13->Width = in_stack_fffffffffffffef0;
  }
  fVar14 = ImRect::GetWidth((ImRect *)(in_RDI + 10));
  fVar14 = ImMax<float>(fVar14 - 0.0,0.0);
  if (local_74 <= fVar14) {
    local_74 = 0.0;
  }
  else {
    local_74 = local_74 - fVar14;
  }
  if ((local_74 <= 0.0) || ((in_RDI[0x16] & 0x40U) == 0)) {
    fVar14 = TabBarCalcMaxTabWidth();
    for (iVar10 = 0; iVar10 < *in_RDI; iVar10 = iVar10 + 1) {
      pIVar11 = ImVector<ImGuiTabItem>::operator[]
                          ((ImVector<ImGuiTabItem> *)
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (int)in_stack_fffffffffffffecc);
      fVar15 = ImMin<float>(pIVar11->ContentWidth,fVar14);
      pIVar11->Width = fVar15;
      if (pIVar11->Width <= 0.0) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,0x1aa4,"TabBarLayout","ImGui ASSERT FAILED: %s","tab->Width > 0.0f");
      }
    }
  }
  else {
    ShrinkWidths((ImGuiShrinkWidthItem *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffeec,local_74);
    for (local_b4 = 0; local_b4 < *in_RDI; local_b4 = local_b4 + 1) {
      pIVar13 = ImVector<ImGuiShrinkWidthItem>::operator[]
                          ((ImVector<ImGuiShrinkWidthItem> *)
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (int)in_stack_fffffffffffffecc);
      fVar14 = (float)(int)pIVar13->Width;
      ImVector<ImGuiShrinkWidthItem>::operator[]
                ((ImVector<ImGuiShrinkWidthItem> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (int)in_stack_fffffffffffffecc);
      pIVar11 = ImVector<ImGuiTabItem>::operator[]
                          ((ImVector<ImGuiTabItem> *)
                           CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (int)in_stack_fffffffffffffecc);
      pIVar11->Width = fVar14;
    }
  }
  local_cc = 0.0;
  local_d0 = 0.0;
  in_RDI[0x11] = 0;
  for (local_d4 = 0; local_d4 < *in_RDI; local_d4 = local_d4 + 1) {
    pIVar11 = ImVector<ImGuiTabItem>::operator[]
                        ((ImVector<ImGuiTabItem> *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (int)in_stack_fffffffffffffecc);
    pIVar11->Offset = local_cc;
    if ((IVar19 == 0) && (tab_bar_00->NavJustMovedToId == pIVar11->ID)) {
      IVar19 = pIVar11->ID;
    }
    local_cc = pIVar11->Width + (tab_bar_00->Style).ItemInnerSpacing.x + local_cc;
    local_d0 = pIVar11->ContentWidth + (tab_bar_00->Style).ItemInnerSpacing.x + local_d0;
  }
  fVar14 = ImMax<float>(local_cc - (tab_bar_00->Style).ItemInnerSpacing.x,0.0);
  in_RDI[0xf] = (int)fVar14;
  fVar14 = ImMax<float>(local_d0 - (tab_bar_00->Style).ItemInnerSpacing.x,0.0);
  in_RDI[0x10] = (int)fVar14;
  fVar14 = (float)in_RDI[0xf];
  fVar15 = ImRect::GetWidth((ImRect *)(in_RDI + 10));
  uVar18 = in_stack_fffffffffffffed4 & 0xffffff;
  if (((fVar15 < fVar14) && (uVar18 = in_stack_fffffffffffffed4 & 0xffffff, 1 < *in_RDI)) &&
     (uVar18 = in_stack_fffffffffffffed4 & 0xffffff, (in_RDI[0x16] & 0x10U) == 0)) {
    uVar18 = CONCAT13((in_RDI[0x16] & 0x80U) != 0,(int3)in_stack_fffffffffffffed4);
  }
  if (((char)(uVar18 >> 0x18) != '\0') &&
     (in_stack_ffffffffffffff10 = (ImGuiTabBar *)TabBarScrollingButtons((ImGuiTabBar *)tab_bar_00),
     in_stack_ffffffffffffff10 != (ImGuiTabBar *)0x0)) {
    IVar19 = (in_stack_ffffffffffffff10->Tabs).Size;
    in_RDI[5] = IVar19;
  }
  if (!bVar1) {
    in_RDI[5] = 0;
  }
  if (((in_RDI[5] == 0) && (in_RDI[6] == 0)) && (local_80 != (ImGuiTabItem *)0x0)) {
    IVar19 = local_80->ID;
    in_RDI[5] = IVar19;
  }
  in_RDI[7] = in_RDI[5];
  *(undefined1 *)((long)in_RDI + 0x62) = 0;
  if ((IVar19 != 0) &&
     (pIVar11 = TabBarFindTabByID((ImGuiTabBar *)
                                  CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0),
     pIVar11 != (ImGuiTabItem *)0x0)) {
    TabBarScrollToTab(in_stack_ffffffffffffff10,pIVar11);
  }
  fVar15 = TabBarScrollClamp((ImGuiTabBar *)CONCAT44(uVar18,fVar14),in_stack_fffffffffffffecc);
  in_RDI[0x12] = (int)fVar15;
  fVar15 = TabBarScrollClamp((ImGuiTabBar *)CONCAT44(uVar18,fVar14),in_stack_fffffffffffffecc);
  in_RDI[0x13] = (int)fVar15;
  if (((float)in_RDI[0x12] != (float)in_RDI[0x13]) ||
     (NAN((float)in_RDI[0x12]) || NAN((float)in_RDI[0x13]))) {
    fVar15 = ImMax<float>((float)in_RDI[0x15],tab_bar_00->FontSize * 70.0);
    in_RDI[0x15] = (int)fVar15;
    fVar15 = ImMax<float>((float)in_RDI[0x15],ABS((float)in_RDI[0x13] - (float)in_RDI[0x12]) / 0.3);
    in_RDI[0x15] = (int)fVar15;
    uVar17 = SUB43(in_stack_fffffffffffffecc,0);
    in_stack_fffffffffffffecc = (float)CONCAT13(1,uVar17);
    if (tab_bar_00->FrameCount <= in_RDI[9] + 1) {
      in_stack_fffffffffffffecc =
           (float)CONCAT13(tab_bar_00->FontSize * 10.0 < (float)in_RDI[0x14],uVar17);
    }
    if ((char)((uint)in_stack_fffffffffffffecc >> 0x18) == '\0') {
      fVar15 = ImLinearSweep(fVar14,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
    }
    else {
      fVar15 = (float)in_RDI[0x13];
    }
    in_RDI[0x12] = (int)fVar15;
  }
  else {
    in_RDI[0x15] = 0;
  }
  if ((in_RDI[0x16] & 0x100000U) == 0) {
    ImVector<char>::resize((ImVector<char> *)CONCAT44(uVar18,fVar14),(int)in_stack_fffffffffffffecc)
    ;
  }
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Compute ideal widths
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->ContentWidth;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        g.ShrinkWidthBuffer[tab_n].Index = tab_n;
        g.ShrinkWidthBuffer[tab_n].Width = tab->ContentWidth;
    }

    // Compute width
    const float initial_offset_x = 0.0f; // g.Style.ItemInnerSpacing.x;
    const float width_avail = ImMax(tab_bar->BarRect.GetWidth() - initial_offset_x, 0.0f);
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index].Width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->ContentWidth, tab_max_width);
            IM_ASSERT(tab->Width > 0.0f);
        }
    }

    // Layout all active tabs
    float offset_x = initial_offset_x;
    float offset_x_ideal = offset_x;
    tab_bar->OffsetNextTab = offset_x; // This is used by non-reorderable tab bar where the submission order is always honored.
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
        offset_x_ideal += tab->ContentWidth + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetMaxIdeal = ImMax(offset_x_ideal - g.Style.ItemInnerSpacing.x, 0.0f);

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);
}